

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,UniformBlock *blk)

{
  qsizetype *pqVar1;
  QTextStream *pQVar2;
  Data *pDVar3;
  Stream *__old_val;
  long in_RDX;
  undefined8 *puVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QDebugStateSaver saver;
  QDebug local_60;
  QDebug local_58;
  undefined1 *local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)blk);
  pQVar2 = (QTextStream *)(blk->blockName).d.d;
  pQVar2[0x30] = (QTextStream)0x0;
  QVar5.m_data = (storage_type *)0xd;
  QVar5.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar5);
  QTextStream::operator<<(pQVar2,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (QTextStream *)(blk->blockName).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  puVar4 = *(undefined8 **)(in_RDX + 8);
  if (puVar4 == (undefined8 *)0x0) {
    puVar4 = &QByteArray::_empty;
  }
  QDebug::putByteArray((char *)blk,(ulong)puVar4,(Latin1Content)*(undefined8 *)(in_RDX + 0x10));
  pQVar2 = (QTextStream *)(blk->blockName).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  QTextStream::operator<<((QTextStream *)(blk->blockName).d.d,' ');
  pQVar2 = (QTextStream *)(blk->blockName).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  puVar4 = *(undefined8 **)(in_RDX + 0x20);
  if (puVar4 == (undefined8 *)0x0) {
    puVar4 = &QByteArray::_empty;
  }
  QDebug::putByteArray((char *)blk,(ulong)puVar4,(Latin1Content)*(undefined8 *)(in_RDX + 0x28));
  pQVar2 = (QTextStream *)(blk->blockName).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  pQVar2 = (QTextStream *)(blk->blockName).d.d;
  QVar6.m_data = &DAT_00000006;
  QVar6.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar6);
  QTextStream::operator<<(pQVar2,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (QTextStream *)(blk->blockName).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  QTextStream::operator<<((QTextStream *)(blk->blockName).d.d,*(int *)(in_RDX + 0x30));
  pQVar2 = (QTextStream *)(blk->blockName).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  if (-1 < *(int *)(in_RDX + 0x34)) {
    pQVar2 = (QTextStream *)(blk->blockName).d.d;
    pQVar2[0x30] = (QTextStream)0x0;
    QVar7.m_data = (storage_type *)0x9;
    QVar7.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar7);
    QTextStream::operator<<(pQVar2,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar2 = (QTextStream *)(blk->blockName).d.d;
    if (pQVar2[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar2,' ');
    }
    QTextStream::operator<<((QTextStream *)(blk->blockName).d.d,*(int *)(in_RDX + 0x34));
    pQVar2 = (QTextStream *)(blk->blockName).d.d;
    if (pQVar2[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar2,' ');
    }
  }
  if (-1 < *(int *)(in_RDX + 0x38)) {
    pQVar2 = (QTextStream *)(blk->blockName).d.d;
    pQVar2[0x30] = (QTextStream)0x0;
    QVar8.m_data = &DAT_00000005;
    QVar8.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar8);
    QTextStream::operator<<(pQVar2,&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar2 = (QTextStream *)(blk->blockName).d.d;
    if (pQVar2[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar2,' ');
    }
    QTextStream::operator<<((QTextStream *)(blk->blockName).d.d,*(int *)(in_RDX + 0x38));
    pQVar2 = (QTextStream *)(blk->blockName).d.d;
    if (pQVar2[0x30] == (QTextStream)0x1) {
      QTextStream::operator<<(pQVar2,' ');
    }
  }
  pQVar2 = (QTextStream *)(blk->blockName).d.d;
  pQVar2[0x30] = (QTextStream)0x0;
  QTextStream::operator<<(pQVar2,' ');
  pQVar2 = (QTextStream *)(blk->blockName).d.d;
  if (pQVar2[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar2,' ');
  }
  local_48.d.d = (Data *)(blk->blockName).d.d;
  pqVar1 = &((Data *)local_48.d.d)[2].super_QArrayData.alloc;
  *(int *)pqVar1 = (int)*pqVar1 + 1;
  local_60.stream = (Stream *)0x0;
  QtPrivate::printSequentialContainer<QList<QShaderDescription::BlockVariable>>
            ((QtPrivate *)&local_58,(Stream *)&local_48,"QList",
             (QList<QShaderDescription::BlockVariable> *)(in_RDX + 0x40));
  QDebug::~QDebug((QDebug *)&local_48);
  QTextStream::operator<<(&(local_58.stream)->ts,')');
  if ((local_58.stream)->space == true) {
    QTextStream::operator<<(&(local_58.stream)->ts,' ');
  }
  QDebug::~QDebug(&local_58);
  QDebug::~QDebug(&local_60);
  pDVar3 = (blk->blockName).d.d;
  (blk->blockName).d.d = (Data *)0x0;
  *(Data **)dbg.stream = pDVar3;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QShaderDescription::UniformBlock &blk)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "UniformBlock(" << blk.blockName << ' ' << blk.structName
                  << " size=" << blk.size;
    if (blk.binding >= 0)
        dbg.nospace() << " binding=" << blk.binding;
    if (blk.descriptorSet >= 0)
        dbg.nospace() << " set=" << blk.descriptorSet;
    dbg.nospace() << ' ' << blk.members << ')';
    return dbg;
}